

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

TPZGeoNodeBC ** __thiscall
TPZVec<TPZGeoNodeBC_*>::operator[](TPZVec<TPZGeoNodeBC_*> *this,int64_t index)

{
  int64_t index_local;
  TPZVec<TPZGeoNodeBC_*> *this_local;
  
  return this->fStore + index;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}